

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::bin_writer<3>>>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
          *f)

{
  type tVar1;
  basic_writer<fmt::v6::buffer_range<char>_> *this_00;
  ulong uVar2;
  char *pcVar3;
  fill_t<char> *fill;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  *this_01;
  char *pcVar4;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  *in_RDX;
  int *in_RSI;
  char **in_RDI;
  size_t left_padding;
  checked_ptr<typename_buffer<char>::value_type> *it;
  size_t fill_size;
  size_t padding;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff88;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  *in_stack_ffffffffffffffa0;
  undefined8 *n;
  
  tVar1 = to_unsigned<int>(*in_RSI);
  this_00 = (basic_writer<fmt::v6::buffer_range<char>_> *)
            basic_writer<fmt::v6::buffer_range<char>_>::
            padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
            ::size(in_RDX);
  if (tVar1 != 0) {
    this_00 = (basic_writer<fmt::v6::buffer_range<char>_> *)
              basic_writer<fmt::v6::buffer_range<char>_>::
              padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
              ::width(in_RDX);
  }
  if (this_00 < (basic_writer<fmt::v6::buffer_range<char>_> *)(ulong)tVar1) {
    uVar2 = (ulong)tVar1 - (long)this_00;
    pcVar3 = (char *)fill_t<char>::size((fill_t<char> *)((long)in_RSI + 10));
    fill = (fill_t<char> *)
           basic_writer<fmt::v6::buffer_range<char>_>::reserve(this_00,in_stack_ffffffffffffff88);
    n = (undefined8 *)&stack0xffffffffffffffa8;
    if ((*(byte *)((long)in_RSI + 9) & 0xf) == 2) {
      pcVar3 = fill<char*,char>(pcVar3,(size_t)n,fill);
      *n = pcVar3;
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
      ::operator()(in_stack_ffffffffffffffa0,in_RDI);
    }
    else if ((*(byte *)((long)in_RSI + 9) & 0xf) == 3) {
      this_01 = (padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
                 *)(uVar2 >> 1);
      pcVar4 = fill<char*,char>(pcVar3,(size_t)n,fill);
      *n = pcVar4;
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
      ::operator()(this_01,in_RDI);
      pcVar3 = fill<char*,char>(pcVar3,(size_t)n,fill);
      *n = pcVar3;
    }
    else {
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
      ::operator()(in_stack_ffffffffffffffa0,in_RDI);
      pcVar3 = fill<char*,char>(pcVar3,(size_t)n,fill);
      *n = pcVar3;
    }
  }
  else {
    basic_writer<fmt::v6::buffer_range<char>_>::reserve(this_00,(size_t)in_RDX);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
    ::operator()(in_stack_ffffffffffffffa0,in_RDI);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }